

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall cmFileAPI::BuildCMake(Value *__return_storage_ptr__,cmFileAPI *this)

{
  Value *pVVar1;
  string *psVar2;
  cmGlobalGenerator *pcVar3;
  Value local_150;
  Value local_128;
  Value local_100;
  Value local_d8;
  Value local_b0;
  Value local_88;
  Value *local_60;
  Value *cmake_paths;
  Value local_48;
  undefined1 local_19;
  cmFileAPI *local_18;
  cmFileAPI *this_local;
  Value *cmake;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  ::cmake::ReportVersionJson(&local_48,this->CMakeInstance);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"version");
  Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_88,objectValue);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"paths");
  pVVar1 = Json::Value::operator=(pVVar1,&local_88);
  Json::Value::~Value(&local_88);
  local_60 = pVVar1;
  psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  Json::Value::Value(&local_b0,psVar2);
  pVVar1 = Json::Value::operator[](local_60,"cmake");
  Json::Value::operator=(pVVar1,&local_b0);
  Json::Value::~Value(&local_b0);
  psVar2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  Json::Value::Value(&local_d8,psVar2);
  pVVar1 = Json::Value::operator[](local_60,"ctest");
  Json::Value::operator=(pVVar1,&local_d8);
  Json::Value::~Value(&local_d8);
  psVar2 = cmSystemTools::GetCPackCommand_abi_cxx11_();
  Json::Value::Value(&local_100,psVar2);
  pVVar1 = Json::Value::operator[](local_60,"cpack");
  Json::Value::operator=(pVVar1,&local_100);
  Json::Value::~Value(&local_100);
  psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  Json::Value::Value(&local_128,psVar2);
  pVVar1 = Json::Value::operator[](local_60,"root");
  Json::Value::operator=(pVVar1,&local_128);
  Json::Value::~Value(&local_128);
  pcVar3 = ::cmake::GetGlobalGenerator(this->CMakeInstance);
  (*pcVar3->_vptr_cmGlobalGenerator[6])(&local_150);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"generator");
  Json::Value::operator=(pVVar1,&local_150);
  Json::Value::~Value(&local_150);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildCMake()
{
  Json::Value cmake = Json::objectValue;
  cmake["version"] = this->CMakeInstance->ReportVersionJson();
  Json::Value& cmake_paths = cmake["paths"] = Json::objectValue;
  cmake_paths["cmake"] = cmSystemTools::GetCMakeCommand();
  cmake_paths["ctest"] = cmSystemTools::GetCTestCommand();
  cmake_paths["cpack"] = cmSystemTools::GetCPackCommand();
  cmake_paths["root"] = cmSystemTools::GetCMakeRoot();
  cmake["generator"] = this->CMakeInstance->GetGlobalGenerator()->GetJson();
  return cmake;
}